

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O1

string * __thiscall
antlr::NoViableAltException::getMessage_abi_cxx11_
          (string *__return_storage_ptr__,NoViableAltException *this)

{
  size_type *psVar1;
  TokenRef *pTVar2;
  ASTRef *pAVar3;
  undefined8 uVar4;
  int iVar5;
  undefined8 *puVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  ulong *local_38;
  long local_30;
  ulong local_28 [2];
  
  pTVar2 = (this->token).ref;
  if ((pTVar2 == (TokenRef *)0x0) || (pTVar2->ptr == (Token *)0x0)) {
    pAVar3 = (this->node).ref;
    if ((pAVar3 != (ASTRef *)0x0) && (pAVar3->ptr != (AST *)0x0)) {
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"unexpected AST node: ","");
      (*((this->node).ref)->ptr->_vptr_AST[0x18])(&local_58);
      uVar9 = 0xf;
      if (local_38 != local_28) {
        uVar9 = local_28[0];
      }
      if (uVar9 < (ulong)(local_50 + local_30)) {
        uVar9 = 0xf;
        if (local_58 != local_48) {
          uVar9 = local_48[0];
        }
        if ((ulong)(local_50 + local_30) <= uVar9) {
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38);
          goto LAB_0018a726;
        }
      }
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58);
LAB_0018a726:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar1 = puVar6 + 2;
      if ((size_type *)*puVar6 == psVar1) {
        uVar4 = puVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
      }
      __return_storage_ptr__->_M_string_length = puVar6[1];
      *puVar6 = psVar1;
      puVar6[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      if (local_38 == local_28) {
        return __return_storage_ptr__;
      }
      operator_delete(local_38,local_28[0] + 1);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "unexpected end of subtree";
    pcVar7 = "";
  }
  else {
    iVar5 = (*pTVar2->ptr->_vptr_Token[6])();
    if (iVar5 == 1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "unexpected end of file";
      pcVar7 = "";
    }
    else {
      iVar5 = (*((this->token).ref)->ptr->_vptr_Token[6])();
      if (iVar5 != 3) {
        local_38 = local_28;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"unexpected token: ","")
        ;
        (*((this->token).ref)->ptr->_vptr_Token[4])(&local_58);
        uVar9 = 0xf;
        if (local_38 != local_28) {
          uVar9 = local_28[0];
        }
        if (uVar9 < (ulong)(local_50 + local_30)) {
          uVar9 = 0xf;
          if (local_58 != local_48) {
            uVar9 = local_48[0];
          }
          if ((ulong)(local_50 + local_30) <= uVar9) {
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38);
            goto LAB_0018a726;
          }
        }
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58);
        goto LAB_0018a726;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "unexpected end of tree";
      pcVar7 = "";
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar7);
  return __return_storage_ptr__;
}

Assistant:

string NoViableAltException::getMessage() const
{
	if (token)
	{
		if( token->getType() == Token::EOF_TYPE )
			return string("unexpected end of file");
		else if( token->getType() == Token::NULL_TREE_LOOKAHEAD )
			return string("unexpected end of tree");
		else
			return string("unexpected token: ")+token->getText();
	}

	// must a tree parser error if token==null
	if (!node)
		return "unexpected end of subtree";

	return string("unexpected AST node: ")+node->toString();
}